

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_image_writer.cpp
# Opt level: O0

void errorFn(png_structp png_ptr,png_const_charp error_msg)

{
  allocator local_61;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *errorStr;
  png_const_charp error_msg_local;
  png_structp png_ptr_local;
  
  errorStr = (string *)error_msg;
  error_msg_local = (png_const_charp)png_ptr;
  local_20 = (string *)png_get_error_ptr(png_ptr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"libpng error: ",&local_61);
  std::operator+(local_40,(char *)local_60);
  std::__cxx11::string::operator=(local_20,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  return;
}

Assistant:

static void errorFn(png_structp png_ptr, png_const_charp error_msg)
{
    auto* errorStr = static_cast<std::string*>(png_get_error_ptr(png_ptr));
    *errorStr = std::string("libpng error: ") + error_msg;
}